

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void cmELFByteSwap(undefined1 *data)

{
  undefined1 uVar1;
  char one_byte;
  char *data_local;
  
  uVar1 = *data;
  *data = data[7];
  data[7] = uVar1;
  uVar1 = data[1];
  data[1] = data[6];
  data[6] = uVar1;
  uVar1 = data[2];
  data[2] = data[5];
  data[5] = uVar1;
  uVar1 = data[3];
  data[3] = data[4];
  data[4] = uVar1;
  return;
}

Assistant:

void cmELFByteSwap(char* data, cmELFByteSwapSize<8> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[7];
  data[7] = one_byte;
  one_byte = data[1];
  data[1] = data[6];
  data[6] = one_byte;
  one_byte = data[2];
  data[2] = data[5];
  data[5] = one_byte;
  one_byte = data[3];
  data[3] = data[4];
  data[4] = one_byte;
}